

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O0

void ON_SortFloatArray(sort_algorithm sort_algorithm,float *a,size_t nel)

{
  size_t nel_local;
  float *a_local;
  sort_algorithm sort_algorithm_local;
  
  if (sort_algorithm == heap_sort) {
    ON_hsort_float(a,nel);
  }
  else {
    ON_qsort_float(a,nel);
  }
  return;
}

Assistant:

void ON_SortFloatArray( 
        ON::sort_algorithm sort_algorithm,
        float* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_float(a,nel);
  else
    ON_qsort_float(a,nel);
}